

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::FileMetaData::read(FileMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<duckdb_parquet::SchemaElement,_true> *this_00;
  pointer pKVar1;
  pointer pKVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer pCVar7;
  pointer pCVar8;
  vector<duckdb_parquet::RowGroup,_true> *this_01;
  vector<duckdb_parquet::KeyValue,_true> *this_02;
  vector<duckdb_parquet::ColumnOrder,_true> *this_03;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  reference pvVar12;
  undefined4 extraout_var_00;
  reference pvVar13;
  undefined4 extraout_var_01;
  ssize_t sVar14;
  reference pvVar15;
  undefined4 extraout_var_02;
  reference pvVar16;
  undefined8 *puVar17;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_04;
  size_type __n;
  size_type __n_00;
  size_type __n_01;
  size_type __n_02;
  pointer pKVar18;
  pointer pRVar19;
  pointer pSVar20;
  pointer pCVar21;
  uint32_t _size229;
  TType _etype232;
  int16_t fid;
  string fname;
  TType ftype;
  uint local_cc;
  FileMetaData *local_c8;
  undefined1 local_c0 [6];
  ushort local_ba;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [20];
  int local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  int32_t *local_70;
  int64_t *local_68;
  vector<duckdb_parquet::RowGroup,_true> *local_60;
  vector<duckdb_parquet::KeyValue,_true> *local_58;
  string *local_50;
  vector<duckdb_parquet::ColumnOrder,_true> *local_48;
  EncryptionAlgorithm *local_40;
  string *local_38;
  
  this_04 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_04);
  local_b8 = local_a8;
  local_b0 = 0;
  local_a8[0] = 0;
  iVar9 = (*this_04->_vptr_TProtocol[0x19])(this_04,&local_b8);
  local_38 = &this->footer_signing_key_metadata;
  local_40 = &this->encryption_algorithm;
  local_48 = &this->column_orders;
  local_50 = &this->created_by;
  local_58 = &this->key_value_metadata;
  local_60 = &this->row_groups;
  local_68 = &this->num_rows;
  this_00 = &this->schema;
  local_70 = &this->version;
  local_78 = 0;
  local_88 = 0;
  local_80 = 0;
  local_90 = 0;
  local_c8 = this;
  do {
    iVar10 = (*this_04->_vptr_TProtocol[0x1b])(this_04,&local_b8,&local_94,&local_ba);
    iVar10 = iVar10 + iVar9;
    if (local_94 == 0) {
      iVar9 = (*this_04->_vptr_TProtocol[0x1a])(this_04);
      if (((byte)local_80 & (byte)local_90 & (byte)local_78 & (byte)local_88 & 1) == 0) {
        puVar17 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar17[1] = puVar17 + 3;
        puVar17[2] = 0;
        *(undefined1 *)(puVar17 + 3) = 0;
        *puVar17 = &PTR__TException_02474880;
        *(undefined4 *)(puVar17 + 5) = 1;
        __cxa_throw(puVar17,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      this_04->input_recursion_depth_ = this_04->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar9 + iVar10);
    }
    switch(local_ba) {
    case 1:
      if (local_94 != 8) {
        iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
        break;
      }
      iVar9 = (*this_04->_vptr_TProtocol[0x27])(this_04,local_70);
      iVar11 = iVar9 + iVar10;
      local_78 = CONCAT71((int7)(CONCAT44(extraout_var,iVar9) >> 8),1);
      goto LAB_01b88d14;
    case 2:
      if (local_94 == 0xf) {
        pSVar5 = (this->schema).
                 super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                 .
                 super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar6 = (this->schema).
                 super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                 .
                 super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pSVar20 = pSVar5;
        if (pSVar6 != pSVar5) {
          do {
            (*(code *)**(undefined8 **)pSVar20)(pSVar20);
            pSVar20 = pSVar20 + 1;
          } while (pSVar20 != pSVar6);
          (local_c8->schema).
          super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          .
          super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
          ._M_impl.super__Vector_impl_data._M_finish = pSVar5;
        }
        iVar11 = (*this_04->_vptr_TProtocol[0x1f])(this_04,local_c0,&local_cc);
        std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
        resize(&this_00->
                super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
               ,(ulong)local_cc);
        this = local_c8;
        iVar11 = iVar11 + iVar10;
        if (local_cc != 0) {
          __n_01 = 0;
          do {
            pvVar15 = duckdb::vector<duckdb_parquet::SchemaElement,_true>::operator[]
                                (this_00,__n_01);
            iVar9 = (**(code **)(*(long *)pvVar15 + 0x10))(pvVar15,this_04);
            iVar11 = iVar11 + iVar9;
            __n_01 = __n_01 + 1;
          } while (__n_01 < local_cc);
        }
        iVar9 = (*this_04->_vptr_TProtocol[0x20])(this_04);
        iVar11 = iVar9 + iVar11;
        local_88 = CONCAT71((int7)(CONCAT44(extraout_var_02,iVar9) >> 8),1);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 3:
      if (local_94 == 10) {
        iVar9 = (*this_04->_vptr_TProtocol[0x28])(this_04,local_68);
        iVar11 = iVar9 + iVar10;
        local_80 = CONCAT71((int7)(CONCAT44(extraout_var_00,iVar9) >> 8),1);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 4:
      if (local_94 == 0xf) {
        pRVar3 = (this->row_groups).
                 super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                 super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pRVar4 = (this->row_groups).
                 super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
                 super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pRVar19 = pRVar3;
        if (pRVar4 != pRVar3) {
          do {
            (*(code *)**(undefined8 **)pRVar19)(pRVar19);
            pRVar19 = pRVar19 + 1;
          } while (pRVar19 != pRVar4);
          (local_c8->row_groups).
          super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
          super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
          _M_impl.super__Vector_impl_data._M_finish = pRVar3;
        }
        iVar11 = (*this_04->_vptr_TProtocol[0x1f])(this_04,local_c0,&local_cc);
        this_01 = local_60;
        std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::resize
                  (&local_60->
                    super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                   ,(ulong)local_cc);
        this = local_c8;
        iVar11 = iVar11 + iVar10;
        if (local_cc != 0) {
          __n_00 = 0;
          do {
            pvVar13 = duckdb::vector<duckdb_parquet::RowGroup,_true>::operator[](this_01,__n_00);
            iVar9 = (**(code **)(*(long *)pvVar13 + 0x10))(pvVar13,this_04);
            iVar11 = iVar11 + iVar9;
            __n_00 = __n_00 + 1;
          } while (__n_00 < local_cc);
        }
        iVar9 = (*this_04->_vptr_TProtocol[0x20])(this_04);
        iVar11 = iVar9 + iVar11;
        local_90 = CONCAT71((int7)(CONCAT44(extraout_var_01,iVar9) >> 8),1);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 5:
      if (local_94 == 0xf) {
        pKVar1 = (this->key_value_metadata).
                 super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                 super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pKVar2 = (this->key_value_metadata).
                 super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
                 super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pKVar18 = pKVar1;
        if (pKVar2 != pKVar1) {
          do {
            (*(code *)**(undefined8 **)pKVar18)(pKVar18);
            pKVar18 = pKVar18 + 1;
          } while (pKVar18 != pKVar2);
          (local_c8->key_value_metadata).
          super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
          super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
          _M_impl.super__Vector_impl_data._M_finish = pKVar1;
        }
        iVar9 = (*this_04->_vptr_TProtocol[0x1f])(this_04,local_c0,&local_cc);
        this_02 = local_58;
        std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::resize
                  (&local_58->
                    super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ,(ulong)local_cc);
        this = local_c8;
        iVar9 = iVar9 + iVar10;
        if (local_cc != 0) {
          __n = 0;
          do {
            pvVar12 = duckdb::vector<duckdb_parquet::KeyValue,_true>::operator[](this_02,__n);
            iVar10 = (**(code **)(*(long *)pvVar12 + 0x10))(pvVar12,this_04);
            iVar9 = iVar9 + iVar10;
            __n = __n + 1;
          } while (__n < local_cc);
        }
        iVar11 = (*this_04->_vptr_TProtocol[0x20])(this_04);
        iVar11 = iVar11 + iVar9;
        this->__isset = (_FileMetaData__isset)((byte)this->__isset | 1);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 6:
      if (local_94 == 0xb) {
        iVar11 = (*this_04->_vptr_TProtocol[0x2a])(this_04,local_50);
        iVar11 = iVar11 + iVar10;
        this->__isset = (_FileMetaData__isset)((byte)this->__isset | 2);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 7:
      if (local_94 == 0xf) {
        pCVar7 = (this->column_orders).
                 super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                 .
                 super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pCVar8 = (this->column_orders).
                 super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                 .
                 super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pCVar21 = pCVar7;
        if (pCVar8 != pCVar7) {
          do {
            (*(code *)**(undefined8 **)pCVar21)(pCVar21);
            pCVar21 = pCVar21 + 1;
          } while (pCVar21 != pCVar8);
          (local_c8->column_orders).
          super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
          super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
          ._M_impl.super__Vector_impl_data._M_finish = pCVar7;
        }
        iVar9 = (*this_04->_vptr_TProtocol[0x1f])(this_04,local_c0,&local_cc);
        this_03 = local_48;
        std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::
        resize(&local_48->
                super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
               ,(ulong)local_cc);
        this = local_c8;
        iVar9 = iVar9 + iVar10;
        if (local_cc != 0) {
          __n_02 = 0;
          do {
            pvVar16 = duckdb::vector<duckdb_parquet::ColumnOrder,_true>::operator[](this_03,__n_02);
            iVar10 = (**(code **)(*(long *)pvVar16 + 0x10))(pvVar16,this_04);
            iVar9 = iVar9 + iVar10;
            __n_02 = __n_02 + 1;
          } while (__n_02 < local_cc);
        }
        iVar11 = (*this_04->_vptr_TProtocol[0x20])(this_04);
        iVar11 = iVar11 + iVar9;
        this->__isset = (_FileMetaData__isset)((byte)this->__isset | 4);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 8:
      if (local_94 == 0xc) {
        sVar14 = EncryptionAlgorithm::read(local_40,__fd,__buf_00,0x1e24d0c);
        iVar11 = (int)sVar14 + iVar10;
        this->__isset = (_FileMetaData__isset)((byte)this->__isset | 8);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    case 9:
      if (local_94 == 0xb) {
        iVar11 = (*this_04->_vptr_TProtocol[0x2b])(this_04,local_38);
        iVar11 = iVar11 + iVar10;
        this->__isset = (_FileMetaData__isset)((byte)this->__isset | 0x10);
        goto LAB_01b88d14;
      }
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
      break;
    default:
      iVar11 = (*this_04->_vptr_TProtocol[0x2c])(this_04);
    }
    iVar11 = iVar11 + iVar10;
LAB_01b88d14:
    iVar9 = (*this_04->_vptr_TProtocol[0x1c])(this_04);
    iVar9 = iVar9 + iVar11;
  } while( true );
}

Assistant:

uint32_t FileMetaData::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_version = false;
  bool isset_schema = false;
  bool isset_num_rows = false;
  bool isset_row_groups = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->version);
          isset_version = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->schema.clear();
            uint32_t _size219;
            ::apache::thrift::protocol::TType _etype222;
            xfer += iprot->readListBegin(_etype222, _size219);
            this->schema.resize(_size219);
            uint32_t _i223;
            for (_i223 = 0; _i223 < _size219; ++_i223)
            {
              xfer += this->schema[_i223].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->row_groups.clear();
            uint32_t _size224;
            ::apache::thrift::protocol::TType _etype227;
            xfer += iprot->readListBegin(_etype227, _size224);
            this->row_groups.resize(_size224);
            uint32_t _i228;
            for (_i228 = 0; _i228 < _size224; ++_i228)
            {
              xfer += this->row_groups[_i228].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_row_groups = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->key_value_metadata.clear();
            uint32_t _size229;
            ::apache::thrift::protocol::TType _etype232;
            xfer += iprot->readListBegin(_etype232, _size229);
            this->key_value_metadata.resize(_size229);
            uint32_t _i233;
            for (_i233 = 0; _i233 < _size229; ++_i233)
            {
              xfer += this->key_value_metadata[_i233].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.key_value_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->created_by);
          this->__isset.created_by = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->column_orders.clear();
            uint32_t _size234;
            ::apache::thrift::protocol::TType _etype237;
            xfer += iprot->readListBegin(_etype237, _size234);
            this->column_orders.resize(_size234);
            uint32_t _i238;
            for (_i238 = 0; _i238 < _size234; ++_i238)
            {
              xfer += this->column_orders[_i238].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.column_orders = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->encryption_algorithm.read(iprot);
          this->__isset.encryption_algorithm = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->footer_signing_key_metadata);
          this->__isset.footer_signing_key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_version)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_row_groups)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}